

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::EnumColumnWriter::FlushPageState
          (EnumColumnWriter *this,WriteStream *temp_writer,ColumnWriterPageState *state_p)

{
  EnumWriterPageState *this_00;
  WriteStream *in_RDI;
  EnumWriterPageState *page_state;
  ColumnWriterPageState *in_stack_ffffffffffffffe0;
  
  this_00 = ColumnWriterPageState::Cast<duckdb::EnumWriterPageState>(in_stack_ffffffffffffffe0);
  if ((this_00->written_value & 1U) == 0) {
    WriteStream::Write<unsigned_char>((WriteStream *)this_00,(uchar)((ulong)in_RDI >> 0x38));
  }
  else {
    RleBpEncoder::FinishWrite((RleBpEncoder *)this_00,in_RDI);
  }
  return;
}

Assistant:

void EnumColumnWriter::FlushPageState(WriteStream &temp_writer, ColumnWriterPageState *state_p) {
	auto &page_state = state_p->Cast<EnumWriterPageState>();
	if (!page_state.written_value) {
		// all values are null
		// just write the bit width
		temp_writer.Write<uint8_t>(bit_width);
		return;
	}
	page_state.encoder.FinishWrite(temp_writer);
}